

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O1

REF_STATUS
ref_mpi_allgatherv(REF_MPI ref_mpi,void *param_2,REF_INT *counts,void *concatenated_array,
                  REF_TYPE type)

{
  int iVar1;
  long lVar2;
  
  if (type == 1) {
    if (0 < *counts) {
      lVar2 = 0;
      do {
        *(undefined4 *)((long)concatenated_array + lVar2 * 4) =
             *(undefined4 *)((long)param_2 + lVar2 * 4);
        lVar2 = lVar2 + 1;
      } while (lVar2 < *counts);
      return 0;
    }
  }
  else if (type == 2) {
    iVar1 = *counts;
    if (0 < (long)iVar1) {
      lVar2 = 0;
      do {
        *(undefined8 *)((long)concatenated_array + lVar2 * 8) =
             *(undefined8 *)((long)param_2 + lVar2 * 8);
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
      return 0;
    }
  }
  else {
    if (type != 3) {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x3ca,
             "ref_mpi_allgatherv",6,"data type");
      return 6;
    }
    iVar1 = *counts;
    if (0 < (long)iVar1) {
      lVar2 = 0;
      do {
        *(undefined8 *)((long)concatenated_array + lVar2 * 8) =
             *(undefined8 *)((long)param_2 + lVar2 * 8);
        lVar2 = lVar2 + 1;
      } while (iVar1 != lVar2);
      return 0;
    }
  }
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_allgatherv(REF_MPI ref_mpi, void *local_array,
                                      REF_INT *counts, void *concatenated_array,
                                      REF_TYPE type) {
#ifdef HAVE_MPI
  REF_INT proc;
  REF_INT *displs;
  MPI_Datatype datatype;
  REF_INT i;
  ref_type_mpi_type(type, datatype);

  if (!ref_mpi_para(ref_mpi)) {
    switch (type) {
      case REF_INT_TYPE:
        for (i = 0; i < counts[0]; i++)
          ((REF_INT *)concatenated_array)[i] = ((REF_INT *)local_array)[i];
        break;
      case REF_LONG_TYPE:
        for (i = 0; i < counts[0]; i++)
          ((REF_LONG *)concatenated_array)[i] = ((REF_LONG *)local_array)[i];
        break;
      case REF_DBL_TYPE:
        for (i = 0; i < counts[0]; i++)
          ((REF_DBL *)concatenated_array)[i] = ((REF_DBL *)local_array)[i];
        break;
      default:
        RSS(REF_IMPLEMENT, "data type");
    }
    return REF_SUCCESS;
  }

  ref_malloc(displs, ref_mpi_n(ref_mpi), REF_INT);

  displs[0] = 0;
  each_ref_mpi_worker(ref_mpi, proc) displs[proc] =
      displs[proc - 1] + counts[proc - 1];

  MPI_Allgatherv(local_array, counts[ref_mpi_rank(ref_mpi)], datatype,
                 concatenated_array, counts, displs, datatype,
                 ref_mpi_comm(ref_mpi));

  ref_free(displs);

#else
  REF_INT i;
  switch (type) {
    case REF_INT_TYPE:
      for (i = 0; i < counts[0]; i++)
        ((REF_INT *)concatenated_array)[i] = ((REF_INT *)local_array)[i];
      break;
    case REF_LONG_TYPE:
      for (i = 0; i < counts[0]; i++)
        ((REF_LONG *)concatenated_array)[i] = ((REF_LONG *)local_array)[i];
      break;
    case REF_DBL_TYPE:
      for (i = 0; i < counts[0]; i++)
        ((REF_DBL *)concatenated_array)[i] = ((REF_DBL *)local_array)[i];
      break;
    default:
      RSS(REF_IMPLEMENT, "data type");
  }
  SUPRESS_UNUSED_COMPILER_WARNING(ref_mpi);
  SUPRESS_UNUSED_COMPILER_WARNING(type);
#endif

  return REF_SUCCESS;
}